

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O1

void __thiscall
testing::internal::GoogleTestFailureReporter::ReportFailure
          (GoogleTestFailureReporter *this,FailureType type,char *file,int line,string *message)

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  
  Message::Message((Message *)&local_30);
  AssertHelper::AssertHelper
            (&local_28,(type == kFatal) + kNonFatalFailure,file,line,(message->_M_dataplus)._M_p);
  AssertHelper::operator=(&local_28,(Message *)&local_30);
  AssertHelper::~AssertHelper(&local_28);
  if (local_30.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = IsTrue(true);
    if ((bVar1) &&
       (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_30.ptr_ + 8))();
    }
    local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  if (type != kFatal) {
    return;
  }
  abort();
}

Assistant:

virtual void ReportFailure(FailureType type, const char* file, int line,
                             const string& message) {
    AssertHelper(type == kFatal ?
                 TestPartResult::kFatalFailure :
                 TestPartResult::kNonFatalFailure,
                 file,
                 line,
                 message.c_str()) = Message();
    if (type == kFatal) {
      posix::Abort();
    }
  }